

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1_test.cc
# Opt level: O2

void TestEmbedType<EMBED_X509_NAME,X509_name_st,X509_name_st,stack_st_X509_NAME>
               (Span<const_unsigned_char> inp,_func_int_X509_name_st_ptr_uint8_t_ptr_ptr *i2d,
               _func_EMBED_X509_NAME_ptr *embed_new,_func_void_EMBED_X509_NAME_ptr *embed_free,
               _func_EMBED_X509_NAME_ptr_EMBED_X509_NAME_ptr_ptr_uint8_t_ptr_ptr_long *d2i_embed,
               _func_int_EMBED_X509_NAME_ptr_uint8_t_ptr_ptr *i2d_embed,
               _func_size_t_stack_st_X509_NAME_ptr *sk_num,
               _func_X509_name_st_ptr_stack_st_X509_NAME_ptr_size_t *sk_value)

{
  _Head_base<0UL,_EMBED_X509_NAME_*,_false> _Var1;
  int iVar2;
  size_t sVar3;
  EMBED_X509_NAME *pEVar4;
  uint8_t *puVar5;
  size_t sVar6;
  X509_name_st *pXVar7;
  uint8_t *puVar8;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  long *plVar9;
  char *message;
  _func_EMBED_X509_NAME_ptr_EMBED_X509_NAME_ptr_ptr_uint8_t_ptr_ptr_long *expected_predicate_value;
  bool bVar10;
  Span<const_unsigned_char> expected;
  Span<const_unsigned_char> expected_00;
  AssertHelper local_118;
  AssertHelper local_110;
  AssertionResult gtest_ar__10;
  AssertionResult gtest_ar__8;
  unique_ptr<EMBED_X509_NAME,_void_(*)(EMBED_X509_NAME_*)> obj;
  CBB seq;
  CBB child;
  uint8_t *ptr;
  ScopedCBB cbb;
  
  sVar6 = inp.size_;
  puVar8 = inp.data_;
  obj._M_t.super___uniq_ptr_impl<EMBED_X509_NAME,_void_(*)(EMBED_X509_NAME_*)>._M_t.
  super__Tuple_impl<0UL,_EMBED_X509_NAME_*,_void_(*)(EMBED_X509_NAME_*)>.
  super__Head_base<0UL,_EMBED_X509_NAME_*,_false>._M_head_impl = (EMBED_X509_NAME *)0x0;
  expected_predicate_value = d2i_embed;
  obj._M_t.super___uniq_ptr_impl<EMBED_X509_NAME,_void_(*)(EMBED_X509_NAME_*)>._M_t.
  super__Tuple_impl<0UL,_EMBED_X509_NAME_*,_void_(*)(EMBED_X509_NAME_*)>.
  super__Tuple_impl<1UL,_void_(*)(EMBED_X509_NAME_*)>.
  super__Head_base<1UL,_void_(*)(EMBED_X509_NAME_*),_false>._M_head_impl =
       (_Head_base<1UL,_void_(*)(EMBED_X509_NAME_*),_false>)
       (_Head_base<1UL,_void_(*)(EMBED_X509_NAME_*),_false>)embed_free;
  CBB_zero(&cbb.ctx_);
  iVar2 = CBB_init(&cbb.ctx_,0x40);
  child.is_child = '\0';
  child._9_7_ = 0;
  child.child._0_1_ = iVar2 != 0;
  if (iVar2 == 0) {
    testing::Message::Message((Message *)&gtest_ar__8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&seq,(internal *)&child,(AssertionResult *)"CBB_init(cbb.get(), 64)",
               "false","true",(char *)expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__10,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
               ,0xbbc,(char *)seq.child);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar__10,(Message *)&gtest_ar__8);
LAB_001cc011:
    this = (unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&child.is_child;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__10);
    std::__cxx11::string::~string((string *)&seq);
    if ((long *)CONCAT71(gtest_ar__8._1_7_,gtest_ar__8.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar__8._1_7_,gtest_ar__8.success_) + 8))();
    }
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&child.is_child);
    iVar2 = CBB_add_asn1_element(&cbb.ctx_,0x20000010,puVar8,sVar6);
    child.is_child = '\0';
    child._9_7_ = 0;
    child.child._0_1_ = iVar2 != 0;
    if (iVar2 == 0) {
      testing::Message::Message((Message *)&gtest_ar__8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&seq,(internal *)&child,
                 (AssertionResult *)
                 "CBB_add_asn1_element(cbb.get(), (0x10u | (0x20u << 24)), inp.data(), inp.size())",
                 "false","true",(char *)expected_predicate_value);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__10,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                 ,0xbbe,(char *)seq.child);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar__10,(Message *)&gtest_ar__8);
      goto LAB_001cc011;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&child.is_child);
    iVar2 = CBB_flush(&cbb.ctx_);
    child.is_child = '\0';
    child._9_7_ = 0;
    child.child._0_1_ = iVar2 != 0;
    if (iVar2 == 0) {
      testing::Message::Message((Message *)&gtest_ar__8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&seq,(internal *)&child,(AssertionResult *)"CBB_flush(cbb.get())","false"
                 ,"true",(char *)expected_predicate_value);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__10,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                 ,0xbbf,(char *)seq.child);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar__10,(Message *)&gtest_ar__8);
      goto LAB_001cc011;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&child.is_child);
    ptr = CBB_data(&cbb.ctx_);
    sVar3 = CBB_len(&cbb.ctx_);
    pEVar4 = (*d2i_embed)((EMBED_X509_NAME **)0x0,&ptr,sVar3);
    std::__uniq_ptr_impl<EMBED_X509_NAME,_void_(*)(EMBED_X509_NAME_*)>::reset
              ((__uniq_ptr_impl<EMBED_X509_NAME,_void_(*)(EMBED_X509_NAME_*)> *)&obj,pEVar4);
    child.is_child = '\0';
    child._9_7_ = 0;
    child.child._0_1_ =
         obj._M_t.super___uniq_ptr_impl<EMBED_X509_NAME,_void_(*)(EMBED_X509_NAME_*)>._M_t.
         super__Tuple_impl<0UL,_EMBED_X509_NAME_*,_void_(*)(EMBED_X509_NAME_*)>.
         super__Head_base<0UL,_EMBED_X509_NAME_*,_false>._M_head_impl != (EMBED_X509_NAME *)0x0;
    if (obj._M_t.super___uniq_ptr_impl<EMBED_X509_NAME,_void_(*)(EMBED_X509_NAME_*)>._M_t.
        super__Tuple_impl<0UL,_EMBED_X509_NAME_*,_void_(*)(EMBED_X509_NAME_*)>.
        super__Head_base<0UL,_EMBED_X509_NAME_*,_false>._M_head_impl == (EMBED_X509_NAME *)0x0) {
      testing::Message::Message((Message *)&gtest_ar__8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&seq,(internal *)&child,(AssertionResult *)0x4e1809,"false","true",
                 (char *)expected_predicate_value);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__10,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                 ,0xbc2,(char *)seq.child);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar__10,(Message *)&gtest_ar__8);
      goto LAB_001cc011;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&child.is_child);
    child.is_child = '\0';
    child._9_7_ = 0;
    bVar10 = (obj._M_t.super___uniq_ptr_impl<EMBED_X509_NAME,_void_(*)(EMBED_X509_NAME_*)>._M_t.
              super__Tuple_impl<0UL,_EMBED_X509_NAME_*,_void_(*)(EMBED_X509_NAME_*)>.
              super__Head_base<0UL,_EMBED_X509_NAME_*,_false>._M_head_impl)->simple ==
             (X509_NAME *)0x0;
    child.child._0_1_ = !bVar10;
    if (bVar10) {
      testing::Message::Message((Message *)&gtest_ar__8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&seq,(internal *)&child,(AssertionResult *)"obj->simple","false","true",
                 (char *)expected_predicate_value);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__10,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                 ,0xbc3,(char *)seq.child);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar__10,(Message *)&gtest_ar__8);
      goto LAB_001cc011;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&child.is_child);
    TestSerialize<X509_name_st*,X509_name_st*>
              ((obj._M_t.super___uniq_ptr_impl<EMBED_X509_NAME,_void_(*)(EMBED_X509_NAME_*)>._M_t.
                super__Tuple_impl<0UL,_EMBED_X509_NAME_*,_void_(*)(EMBED_X509_NAME_*)>.
                super__Head_base<0UL,_EMBED_X509_NAME_*,_false>._M_head_impl)->simple,i2d,inp);
    child.is_child = '\0';
    child._9_7_ = 0;
    child.child._0_1_ =
         (obj._M_t.super___uniq_ptr_impl<EMBED_X509_NAME,_void_(*)(EMBED_X509_NAME_*)>._M_t.
          super__Tuple_impl<0UL,_EMBED_X509_NAME_*,_void_(*)(EMBED_X509_NAME_*)>.
          super__Head_base<0UL,_EMBED_X509_NAME_*,_false>._M_head_impl)->opt == (X509_NAME *)0x0;
    if (!(bool)child.child._0_1_) {
      testing::Message::Message((Message *)&gtest_ar__8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&seq,(internal *)&child,(AssertionResult *)"obj->opt","true","false",
                 (char *)expected_predicate_value);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__10,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                 ,0xbc6,(char *)seq.child);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar__10,(Message *)&gtest_ar__8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__10);
      std::__cxx11::string::~string((string *)&seq);
      if ((long *)CONCAT71(gtest_ar__8._1_7_,gtest_ar__8.success_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(gtest_ar__8._1_7_,gtest_ar__8.success_) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&child.is_child);
    child.is_child = '\0';
    child._9_7_ = 0;
    child.child._0_1_ =
         (obj._M_t.super___uniq_ptr_impl<EMBED_X509_NAME,_void_(*)(EMBED_X509_NAME_*)>._M_t.
          super__Tuple_impl<0UL,_EMBED_X509_NAME_*,_void_(*)(EMBED_X509_NAME_*)>.
          super__Head_base<0UL,_EMBED_X509_NAME_*,_false>._M_head_impl)->seq ==
         (stack_st_X509_NAME *)0x0;
    if (!(bool)child.child._0_1_) {
      testing::Message::Message((Message *)&gtest_ar__8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&seq,(internal *)&child,(AssertionResult *)"obj->seq","true","false",
                 (char *)expected_predicate_value);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__10,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                 ,0xbc7,(char *)seq.child);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar__10,(Message *)&gtest_ar__8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__10);
      std::__cxx11::string::~string((string *)&seq);
      if ((long *)CONCAT71(gtest_ar__8._1_7_,gtest_ar__8.success_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(gtest_ar__8._1_7_,gtest_ar__8.success_) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&child.is_child);
    _Var1 = obj._M_t.super___uniq_ptr_impl<EMBED_X509_NAME,_void_(*)(EMBED_X509_NAME_*)>._M_t.
            super__Tuple_impl<0UL,_EMBED_X509_NAME_*,_void_(*)(EMBED_X509_NAME_*)>.
            super__Head_base<0UL,_EMBED_X509_NAME_*,_false>;
    puVar5 = CBB_data(&cbb.ctx_);
    sVar3 = CBB_len(&cbb.ctx_);
    expected.size_ = sVar3;
    expected.data_ = puVar5;
    TestSerialize<EMBED_X509_NAME*,EMBED_X509_NAME*>(_Var1._M_head_impl,i2d_embed,expected);
    bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::Reset(&cbb);
    iVar2 = CBB_init(&cbb.ctx_,0x40);
    this = (unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&child.is_child;
    child.is_child = '\0';
    child._9_7_ = 0;
    child.child._0_1_ = iVar2 != 0;
    if (iVar2 == 0) {
      testing::Message::Message((Message *)&gtest_ar__8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&seq,(internal *)&child,(AssertionResult *)"CBB_init(cbb.get(), 64)",
                 "false","true",(char *)expected_predicate_value);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__10,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                 ,0xbcd,(char *)seq.child);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar__10,(Message *)&gtest_ar__8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__10);
      std::__cxx11::string::~string((string *)&seq);
      plVar9 = (long *)CONCAT71(gtest_ar__8._1_7_,gtest_ar__8.success_);
LAB_001cc3f5:
      if (plVar9 != (long *)0x0) {
        (**(code **)(*plVar9 + 8))();
      }
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(this);
      iVar2 = CBB_add_asn1(&cbb.ctx_,&seq,0x20000010);
      gtest_ar__8.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar__8.success_ = iVar2 != 0;
      if (iVar2 == 0) {
        testing::Message::Message((Message *)&gtest_ar__10);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&child,(internal *)&gtest_ar__8,
                   (AssertionResult *)"CBB_add_asn1(cbb.get(), &seq, (0x10u | (0x20u << 24)))",
                   "false","true",(char *)expected_predicate_value);
        testing::internal::AssertHelper::AssertHelper
                  (&local_118,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                   ,0xbcf,(char *)CONCAT71(child.child._1_7_,child.child._0_1_));
        testing::internal::AssertHelper::operator=(&local_118,(Message *)&gtest_ar__10);
LAB_001cc19e:
        this = &gtest_ar__8.message_;
        testing::internal::AssertHelper::~AssertHelper(&local_118);
        std::__cxx11::string::~string((string *)&child);
        plVar9 = (long *)gtest_ar__10._0_8_;
        goto LAB_001cc3f5;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar__8.message_);
      iVar2 = CBB_add_bytes(&seq,puVar8,sVar6);
      gtest_ar__8.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar__8.success_ = iVar2 != 0;
      if (iVar2 == 0) {
        testing::Message::Message((Message *)&gtest_ar__10);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&child,(internal *)&gtest_ar__8,
                   (AssertionResult *)"CBB_add_bytes(&seq, inp.data(), inp.size())","false","true",
                   (char *)expected_predicate_value);
        testing::internal::AssertHelper::AssertHelper
                  (&local_118,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                   ,0xbd0,(char *)CONCAT71(child.child._1_7_,child.child._0_1_));
        testing::internal::AssertHelper::operator=(&local_118,(Message *)&gtest_ar__10);
        goto LAB_001cc19e;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar__8.message_);
      iVar2 = CBB_add_asn1(&seq,&child,0xa0000000);
      gtest_ar__10.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar__10.success_ = iVar2 != 0;
      if (iVar2 == 0) {
        testing::Message::Message((Message *)&local_118);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__8,(internal *)&gtest_ar__10,
                   (AssertionResult *)
                   "CBB_add_asn1( &seq, &child, (0x80u << 24) | (0x20u << 24) | 0)","false","true",
                   (char *)expected_predicate_value);
        testing::internal::AssertHelper::AssertHelper
                  (&local_110,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                   ,0xbd3,(char *)CONCAT71(gtest_ar__8._1_7_,gtest_ar__8.success_));
        testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_118);
LAB_001cc3dd:
        this = &gtest_ar__10.message_;
        testing::internal::AssertHelper::~AssertHelper(&local_110);
        std::__cxx11::string::~string((string *)&gtest_ar__8);
        plVar9 = (long *)CONCAT44(local_118.data_._4_4_,local_118.data_._0_4_);
        goto LAB_001cc3f5;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar__10.message_);
      iVar2 = CBB_add_bytes(&child,puVar8,sVar6);
      gtest_ar__10.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar__10.success_ = iVar2 != 0;
      if (iVar2 == 0) {
        testing::Message::Message((Message *)&local_118);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__8,(internal *)&gtest_ar__10,
                   (AssertionResult *)"CBB_add_bytes(&child, inp.data(), inp.size())","false","true"
                   ,(char *)expected_predicate_value);
        testing::internal::AssertHelper::AssertHelper
                  (&local_110,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                   ,0xbd4,(char *)CONCAT71(gtest_ar__8._1_7_,gtest_ar__8.success_));
        testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_118);
        goto LAB_001cc3dd;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar__10.message_);
      iVar2 = CBB_add_asn1(&seq,&child,0xa0000001);
      gtest_ar__10.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar__10.success_ = iVar2 != 0;
      if (iVar2 == 0) {
        testing::Message::Message((Message *)&local_118);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__8,(internal *)&gtest_ar__10,
                   (AssertionResult *)
                   "CBB_add_asn1( &seq, &child, (0x80u << 24) | (0x20u << 24) | 1)","false","true",
                   (char *)expected_predicate_value);
        testing::internal::AssertHelper::AssertHelper
                  (&local_110,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                   ,0xbd6,(char *)CONCAT71(gtest_ar__8._1_7_,gtest_ar__8.success_));
        testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_118);
        goto LAB_001cc3dd;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar__10.message_);
      iVar2 = CBB_add_bytes(&child,puVar8,sVar6);
      gtest_ar__10.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar__10.success_ = iVar2 != 0;
      if (iVar2 == 0) {
        testing::Message::Message((Message *)&local_118);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__8,(internal *)&gtest_ar__10,
                   (AssertionResult *)"CBB_add_bytes(&child, inp.data(), inp.size())","false","true"
                   ,(char *)expected_predicate_value);
        testing::internal::AssertHelper::AssertHelper
                  (&local_110,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                   ,0xbd7,(char *)CONCAT71(gtest_ar__8._1_7_,gtest_ar__8.success_));
        testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_118);
        goto LAB_001cc3dd;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar__10.message_);
      iVar2 = CBB_add_bytes(&child,puVar8,sVar6);
      gtest_ar__10.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar__10.success_ = iVar2 != 0;
      if (iVar2 == 0) {
        testing::Message::Message((Message *)&local_118);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__8,(internal *)&gtest_ar__10,
                   (AssertionResult *)"CBB_add_bytes(&child, inp.data(), inp.size())","false","true"
                   ,(char *)expected_predicate_value);
        testing::internal::AssertHelper::AssertHelper
                  (&local_110,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                   ,0xbd8,(char *)CONCAT71(gtest_ar__8._1_7_,gtest_ar__8.success_));
        testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_118);
        goto LAB_001cc3dd;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar__10.message_);
      iVar2 = CBB_flush(&cbb.ctx_);
      gtest_ar__10.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar__10.success_ = iVar2 != 0;
      if (iVar2 == 0) {
        testing::Message::Message((Message *)&local_118);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__8,(internal *)&gtest_ar__10,
                   (AssertionResult *)"CBB_flush(cbb.get())","false","true",
                   (char *)expected_predicate_value);
        testing::internal::AssertHelper::AssertHelper
                  (&local_110,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                   ,0xbd9,(char *)CONCAT71(gtest_ar__8._1_7_,gtest_ar__8.success_));
        testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_118);
        goto LAB_001cc3dd;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar__10.message_);
      ptr = CBB_data(&cbb.ctx_);
      sVar6 = CBB_len(&cbb.ctx_);
      pEVar4 = (*d2i_embed)((EMBED_X509_NAME **)0x0,&ptr,sVar6);
      std::__uniq_ptr_impl<EMBED_X509_NAME,_void_(*)(EMBED_X509_NAME_*)>::reset
                ((__uniq_ptr_impl<EMBED_X509_NAME,_void_(*)(EMBED_X509_NAME_*)> *)&obj,pEVar4);
      gtest_ar__10.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar__10.success_ =
           obj._M_t.super___uniq_ptr_impl<EMBED_X509_NAME,_void_(*)(EMBED_X509_NAME_*)>._M_t.
           super__Tuple_impl<0UL,_EMBED_X509_NAME_*,_void_(*)(EMBED_X509_NAME_*)>.
           super__Head_base<0UL,_EMBED_X509_NAME_*,_false>._M_head_impl != (EMBED_X509_NAME *)0x0;
      if (obj._M_t.super___uniq_ptr_impl<EMBED_X509_NAME,_void_(*)(EMBED_X509_NAME_*)>._M_t.
          super__Tuple_impl<0UL,_EMBED_X509_NAME_*,_void_(*)(EMBED_X509_NAME_*)>.
          super__Head_base<0UL,_EMBED_X509_NAME_*,_false>._M_head_impl == (EMBED_X509_NAME *)0x0) {
        testing::Message::Message((Message *)&local_118);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__8,(internal *)&gtest_ar__10,(AssertionResult *)0x4e1809,
                   "false","true",(char *)expected_predicate_value);
        testing::internal::AssertHelper::AssertHelper
                  (&local_110,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                   ,0xbdc,(char *)CONCAT71(gtest_ar__8._1_7_,gtest_ar__8.success_));
        testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_118);
LAB_001cc514:
        this = &gtest_ar__10.message_;
        testing::internal::AssertHelper::~AssertHelper(&local_110);
        std::__cxx11::string::~string((string *)&gtest_ar__8);
        if ((long *)CONCAT44(local_118.data_._4_4_,local_118.data_._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_118.data_._4_4_,local_118.data_._0_4_) + 8))();
        }
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar__10.message_);
        gtest_ar__10.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        bVar10 = (obj._M_t.super___uniq_ptr_impl<EMBED_X509_NAME,_void_(*)(EMBED_X509_NAME_*)>._M_t.
                  super__Tuple_impl<0UL,_EMBED_X509_NAME_*,_void_(*)(EMBED_X509_NAME_*)>.
                  super__Head_base<0UL,_EMBED_X509_NAME_*,_false>._M_head_impl)->simple ==
                 (X509_NAME *)0x0;
        gtest_ar__10.success_ = !bVar10;
        if (bVar10) {
          testing::Message::Message((Message *)&local_118);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__8,(internal *)&gtest_ar__10,
                     (AssertionResult *)"obj->simple","false","true",
                     (char *)expected_predicate_value);
          testing::internal::AssertHelper::AssertHelper
                    (&local_110,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                     ,0xbdd,(char *)CONCAT71(gtest_ar__8._1_7_,gtest_ar__8.success_));
          testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_118);
          goto LAB_001cc514;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar__10.message_);
        TestSerialize<X509_name_st*,X509_name_st*>
                  ((obj._M_t.super___uniq_ptr_impl<EMBED_X509_NAME,_void_(*)(EMBED_X509_NAME_*)>.
                    _M_t.super__Tuple_impl<0UL,_EMBED_X509_NAME_*,_void_(*)(EMBED_X509_NAME_*)>.
                    super__Head_base<0UL,_EMBED_X509_NAME_*,_false>._M_head_impl)->simple,i2d,inp);
        gtest_ar__10.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        bVar10 = (obj._M_t.super___uniq_ptr_impl<EMBED_X509_NAME,_void_(*)(EMBED_X509_NAME_*)>._M_t.
                  super__Tuple_impl<0UL,_EMBED_X509_NAME_*,_void_(*)(EMBED_X509_NAME_*)>.
                  super__Head_base<0UL,_EMBED_X509_NAME_*,_false>._M_head_impl)->opt ==
                 (X509_NAME *)0x0;
        gtest_ar__10.success_ = !bVar10;
        if (bVar10) {
          testing::Message::Message((Message *)&local_118);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__8,(internal *)&gtest_ar__10,(AssertionResult *)"obj->opt",
                     "false","true",(char *)expected_predicate_value);
          testing::internal::AssertHelper::AssertHelper
                    (&local_110,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                     ,0xbdf,(char *)CONCAT71(gtest_ar__8._1_7_,gtest_ar__8.success_));
          testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_118);
          goto LAB_001cc514;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar__10.message_);
        TestSerialize<X509_name_st*,X509_name_st*>
                  ((obj._M_t.super___uniq_ptr_impl<EMBED_X509_NAME,_void_(*)(EMBED_X509_NAME_*)>.
                    _M_t.super__Tuple_impl<0UL,_EMBED_X509_NAME_*,_void_(*)(EMBED_X509_NAME_*)>.
                    super__Head_base<0UL,_EMBED_X509_NAME_*,_false>._M_head_impl)->opt,i2d,inp);
        gtest_ar__10._0_8_ =
             (*sk_num)((obj._M_t.super___uniq_ptr_impl<EMBED_X509_NAME,_void_(*)(EMBED_X509_NAME_*)>
                        ._M_t.super__Tuple_impl<0UL,_EMBED_X509_NAME_*,_void_(*)(EMBED_X509_NAME_*)>
                        .super__Head_base<0UL,_EMBED_X509_NAME_*,_false>._M_head_impl)->seq);
        local_118.data_._0_4_ = 2;
        testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
                  ((internal *)&gtest_ar__8,"sk_num(obj->seq)","2u",(unsigned_long *)&gtest_ar__10,
                   (uint *)&local_118);
        if (gtest_ar__8.success_ != false) {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar__8.message_);
          pXVar7 = (*sk_value)((obj._M_t.
                                super___uniq_ptr_impl<EMBED_X509_NAME,_void_(*)(EMBED_X509_NAME_*)>.
                                _M_t.
                                super__Tuple_impl<0UL,_EMBED_X509_NAME_*,_void_(*)(EMBED_X509_NAME_*)>
                                .super__Head_base<0UL,_EMBED_X509_NAME_*,_false>._M_head_impl)->seq,
                               0);
          TestSerialize<X509_name_st*,X509_name_st*>(pXVar7,i2d,inp);
          pXVar7 = (*sk_value)((obj._M_t.
                                super___uniq_ptr_impl<EMBED_X509_NAME,_void_(*)(EMBED_X509_NAME_*)>.
                                _M_t.
                                super__Tuple_impl<0UL,_EMBED_X509_NAME_*,_void_(*)(EMBED_X509_NAME_*)>
                                .super__Head_base<0UL,_EMBED_X509_NAME_*,_false>._M_head_impl)->seq,
                               1);
          TestSerialize<X509_name_st*,X509_name_st*>(pXVar7,i2d,inp);
          _Var1 = obj._M_t.super___uniq_ptr_impl<EMBED_X509_NAME,_void_(*)(EMBED_X509_NAME_*)>._M_t.
                  super__Tuple_impl<0UL,_EMBED_X509_NAME_*,_void_(*)(EMBED_X509_NAME_*)>.
                  super__Head_base<0UL,_EMBED_X509_NAME_*,_false>;
          puVar8 = CBB_data(&cbb.ctx_);
          sVar6 = CBB_len(&cbb.ctx_);
          expected_00.size_ = sVar6;
          expected_00.data_ = puVar8;
          TestSerialize<EMBED_X509_NAME*,EMBED_X509_NAME*>(_Var1._M_head_impl,i2d_embed,expected_00)
          ;
          goto LAB_001cc03d;
        }
        testing::Message::Message((Message *)&gtest_ar__10);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar__8.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          message = "";
        }
        else {
          message = *(char **)gtest_ar__8.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_118,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                   ,0xbe1,message);
        testing::internal::AssertHelper::operator=(&local_118,(Message *)&gtest_ar__10);
        this = &gtest_ar__8.message_;
        testing::internal::AssertHelper::~AssertHelper(&local_118);
        if (gtest_ar__10._0_8_ != 0) {
          (**(code **)(*(long *)gtest_ar__10._0_8_ + 8))();
        }
      }
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(this);
LAB_001cc03d:
  bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated(&cbb);
  std::unique_ptr<EMBED_X509_NAME,_void_(*)(EMBED_X509_NAME_*)>::~unique_ptr(&obj);
  return;
}

Assistant:

void TestEmbedType(bssl::Span<const uint8_t> inp,
                   int (*i2d)(MaybeConstT *, uint8_t **),
                   EmbedT *(*embed_new)(), void (*embed_free)(EmbedT *),
                   EmbedT *(*d2i_embed)(EmbedT **, const uint8_t **, long),
                   int (*i2d_embed)(EmbedT *, uint8_t **),
                   size_t (*sk_num)(const StackT *),
                   T *(*sk_value)(const StackT *, size_t)) {
  std::unique_ptr<EmbedT, decltype(embed_free)> obj(nullptr, embed_free);

  // Test only the first field present.
  bssl::ScopedCBB cbb;
  ASSERT_TRUE(CBB_init(cbb.get(), 64));
  ASSERT_TRUE(CBB_add_asn1_element(cbb.get(), CBS_ASN1_SEQUENCE, inp.data(),
                                   inp.size()));
  ASSERT_TRUE(CBB_flush(cbb.get()));
  const uint8_t *ptr = CBB_data(cbb.get());
  obj.reset(d2i_embed(nullptr, &ptr, CBB_len(cbb.get())));
  ASSERT_TRUE(obj);
  ASSERT_TRUE(obj->simple);
  // Test the field was parsed correctly by reserializing it.
  TestSerialize(obj->simple, i2d, inp);
  EXPECT_FALSE(obj->opt);
  EXPECT_FALSE(obj->seq);
  TestSerialize(obj.get(), i2d_embed,
                {CBB_data(cbb.get()), CBB_len(cbb.get())});

  // Test all fields present.
  cbb.Reset();
  ASSERT_TRUE(CBB_init(cbb.get(), 64));
  CBB seq;
  ASSERT_TRUE(CBB_add_asn1(cbb.get(), &seq, CBS_ASN1_SEQUENCE));
  ASSERT_TRUE(CBB_add_bytes(&seq, inp.data(), inp.size()));
  CBB child;
  ASSERT_TRUE(CBB_add_asn1(
      &seq, &child, CBS_ASN1_CONTEXT_SPECIFIC | CBS_ASN1_CONSTRUCTED | 0));
  ASSERT_TRUE(CBB_add_bytes(&child, inp.data(), inp.size()));
  ASSERT_TRUE(CBB_add_asn1(
      &seq, &child, CBS_ASN1_CONTEXT_SPECIFIC | CBS_ASN1_CONSTRUCTED | 1));
  ASSERT_TRUE(CBB_add_bytes(&child, inp.data(), inp.size()));
  ASSERT_TRUE(CBB_add_bytes(&child, inp.data(), inp.size()));
  ASSERT_TRUE(CBB_flush(cbb.get()));
  ptr = CBB_data(cbb.get());
  obj.reset(d2i_embed(nullptr, &ptr, CBB_len(cbb.get())));
  ASSERT_TRUE(obj);
  ASSERT_TRUE(obj->simple);
  TestSerialize(obj->simple, i2d, inp);
  ASSERT_TRUE(obj->opt);
  TestSerialize(obj->opt, i2d, inp);
  ASSERT_EQ(sk_num(obj->seq), 2u);
  TestSerialize(sk_value(obj->seq, 0), i2d, inp);
  TestSerialize(sk_value(obj->seq, 1), i2d, inp);
  TestSerialize(obj.get(), i2d_embed,
                {CBB_data(cbb.get()), CBB_len(cbb.get())});
}